

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void obj_move_timers(obj *src,obj *dest)

{
  timer_element *local_28;
  timer_element *curr;
  int count;
  obj *dest_local;
  obj *src_local;
  
  curr._4_4_ = 0;
  for (local_28 = src->olev->lev_timers; local_28 != (timer_element *)0x0; local_28 = local_28->next
      ) {
    if ((local_28->kind == 2) && ((obj *)local_28->arg == src)) {
      local_28->arg = dest;
      dest->timed = dest->timed + '\x01';
      curr._4_4_ = curr._4_4_ + 1;
    }
  }
  if (curr._4_4_ != src->timed) {
    panic("obj_move_timers");
  }
  src->timed = '\0';
  return;
}

Assistant:

void obj_move_timers(struct obj *src, struct obj *dest)
{
    int count;
    timer_element *curr;

    for (count = 0, curr = src->olev->lev_timers; curr; curr = curr->next)
	if (curr->kind == TIMER_OBJECT && curr->arg == src) {
	    curr->arg = dest;
	    dest->timed++;
	    count++;
	}
    if (count != src->timed)
	panic("obj_move_timers");
    src->timed = 0;
}